

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

int __thiscall
smf::MidiFile::extractMidiData
          (MidiFile *this,istream *input,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *array,uchar *runningCommand)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  void *pvVar4;
  ulong uVar5;
  int local_58;
  int i;
  int length_1;
  int j;
  uchar byte4;
  uchar byte3;
  uchar byte2;
  uchar byte1;
  ulong length;
  byte local_35;
  int runningQ;
  uchar byte;
  byte *pbStack_30;
  int character;
  uchar *runningCommand_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *array_local;
  istream *input_local;
  MidiFile *this_local;
  
  pbStack_30 = runningCommand;
  runningCommand_local = (uchar *)array;
  array_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)input;
  input_local = (istream *)this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(array);
  runningQ = std::istream::get();
  if (runningQ == -1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error: unexpected end of file.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    return 0;
  }
  local_35 = (byte)runningQ;
  if (local_35 < 0x80) {
    length._4_4_ = 1;
    if (*pbStack_30 == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "Error: running command with no previous command");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return 0;
    }
    if (0xef < *pbStack_30) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "Error: running status not permitted with meta and sysex");
      poVar3 = std::operator<<(poVar3," event.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cerr,"Byte is 0x");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
      pvVar4 = (void *)std::ostream::operator<<(pvVar4,(uint)local_35);
      pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::dec);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      return 0;
    }
  }
  else {
    *pbStack_30 = local_35;
    length._4_4_ = 0;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)runningCommand_local,
             pbStack_30);
  if (length._4_4_ != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)runningCommand_local,
               &local_35);
  }
  bVar1 = *pbStack_30 & 0xf0;
  if ((((bVar1 != 0x80) && (bVar1 != 0x90)) && (bVar1 != 0xa0)) && (bVar1 != 0xb0)) {
    if ((bVar1 == 0xc0) || (bVar1 == 0xd0)) {
      if (length._4_4_ != 0) {
        return 1;
      }
      local_35 = readByte(this,(istream *)array_local);
      bVar2 = status(this);
      if (bVar2) {
        if (local_35 < 0x80) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)runningCommand_local,
                     &local_35);
          return 1;
        }
        poVar3 = std::operator<<((ostream *)&std::cerr,"MIDI data byte too large: ");
        pvVar4 = (void *)std::ostream::operator<<(poVar3,(uint)local_35);
        std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
        this->m_rwstatus = false;
        return (uint)(this->m_rwstatus & 1);
      }
      return (uint)(this->m_rwstatus & 1);
    }
    if (bVar1 != 0xe0) {
      if (bVar1 != 0xf0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Error reading midifile");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cout,"Command byte was ");
        pvVar4 = (void *)std::ostream::operator<<(poVar3,(uint)*pbStack_30);
        std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
        return 0;
      }
      bVar1 = *pbStack_30;
      if ((bVar1 == 0xf0) || (bVar1 == 0xf7)) {
        uVar5 = readVLValue(this,(istream *)array_local);
        local_58 = 0;
        while( true ) {
          if ((int)uVar5 <= local_58) {
            return 1;
          }
          local_35 = readByte(this,(istream *)array_local);
          bVar2 = status(this);
          if (!bVar2) break;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)runningCommand_local,
                     &local_35);
          local_58 = local_58 + 1;
        }
        return (uint)(this->m_rwstatus & 1);
      }
      if (bVar1 != 0xff) {
        return 1;
      }
      if (length._4_4_ == 0) {
        local_35 = readByte(this,(istream *)array_local);
        bVar2 = status(this);
        if (!bVar2) {
          return (uint)(this->m_rwstatus & 1);
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)runningCommand_local,
                   &local_35);
      }
      _j = 0;
      length_1._3_1_ = 0;
      length_1._2_1_ = 0;
      length_1._1_1_ = 0;
      length_1._0_1_ = 0;
      length_1._3_1_ = readByte(this,(istream *)array_local);
      bVar2 = status(this);
      if (bVar2) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)runningCommand_local,
                   (value_type_conflict *)((long)&length_1 + 3));
        if (length_1._3_1_ < 0x80) {
          _j = (ulong)length_1._3_1_;
        }
        else {
          length_1._2_1_ = readByte(this,(istream *)array_local);
          bVar2 = status(this);
          if (!bVar2) {
            return (uint)(this->m_rwstatus & 1);
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)runningCommand_local,
                     (value_type_conflict *)((long)&length_1 + 2));
          if (length_1._2_1_ < 0x81) {
            _j = unpackVLV(this,length_1._3_1_,length_1._2_1_,'\0','\0','\0');
            if ((this->m_rwstatus & 1U) == 0) {
              return (uint)(this->m_rwstatus & 1);
            }
          }
          else {
            length_1._1_1_ = readByte(this,(istream *)array_local);
            bVar2 = status(this);
            if (!bVar2) {
              return (uint)(this->m_rwstatus & 1);
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)runningCommand_local
                       ,(value_type_conflict *)((long)&length_1 + 1));
            if (length_1._1_1_ < 0x80) {
              _j = unpackVLV(this,length_1._3_1_,length_1._2_1_,length_1._1_1_,'\0','\0');
              if ((this->m_rwstatus & 1U) == 0) {
                return (uint)(this->m_rwstatus & 1);
              }
            }
            else {
              length_1._0_1_ = readByte(this,(istream *)array_local);
              bVar2 = status(this);
              if (!bVar2) {
                return (uint)(this->m_rwstatus & 1);
              }
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         runningCommand_local,(value_type_conflict *)&length_1);
              if (0x7f < (byte)length_1) {
                poVar3 = std::operator<<((ostream *)&std::cerr,"Error: cannot handle large VLVs");
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                this->m_rwstatus = false;
                return (uint)(this->m_rwstatus & 1);
              }
              _j = unpackVLV(this,length_1._3_1_,length_1._2_1_,length_1._1_1_,(byte)length_1,'\0');
              if ((this->m_rwstatus & 1U) == 0) {
                return (uint)(this->m_rwstatus & 1);
              }
            }
          }
        }
        i = 0;
        while( true ) {
          if ((int)_j <= i) {
            return 1;
          }
          local_35 = readByte(this,(istream *)array_local);
          bVar2 = status(this);
          if (!bVar2) break;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)runningCommand_local,
                     &local_35);
          i = i + 1;
        }
        return (uint)(this->m_rwstatus & 1);
      }
      return (uint)(this->m_rwstatus & 1);
    }
  }
  local_35 = readByte(this,(istream *)array_local);
  bVar2 = status(this);
  if (!bVar2) {
    return (uint)(this->m_rwstatus & 1);
  }
  if (0x7f < local_35) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"MIDI data byte too large: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,(uint)local_35);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    this->m_rwstatus = false;
    return (uint)(this->m_rwstatus & 1);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)runningCommand_local,&local_35
            );
  if (length._4_4_ == 0) {
    local_35 = readByte(this,(istream *)array_local);
    bVar2 = status(this);
    if (!bVar2) {
      return (uint)(this->m_rwstatus & 1);
    }
    if (0x7f < local_35) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"MIDI data byte too large: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,(uint)local_35);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      this->m_rwstatus = false;
      return (uint)(this->m_rwstatus & 1);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)runningCommand_local,
               &local_35);
  }
  return 1;
}

Assistant:

int MidiFile::extractMidiData(std::istream& input, std::vector<uchar>& array,
	uchar& runningCommand) {

	int character;
	uchar byte;
	array.clear();
	int runningQ;

	character = input.get();
	if (character == EOF) {
		std::cerr << "Error: unexpected end of file." << std::endl;
		return 0;
	} else {
		byte = (uchar)character;
	}

	if (byte < 0x80) {
		runningQ = 1;
		if (runningCommand == 0) {
			std::cerr << "Error: running command with no previous command" << std::endl;
			return 0;
		}
		if (runningCommand >= 0xf0) {
			std::cerr << "Error: running status not permitted with meta and sysex"
			     << " event." << std::endl;
			std::cerr << "Byte is 0x" << std::hex << (int)byte << std::dec << std::endl;
			return 0;
		}
	} else {
		runningCommand = byte;
		runningQ = 0;
	}

	array.push_back(runningCommand);
	if (runningQ) {
		array.push_back(byte);
	}

	switch (runningCommand & 0xf0) {
		case 0x80:        // note off (2 more bytes)
		case 0x90:        // note on (2 more bytes)
		case 0xA0:        // aftertouch (2 more bytes)
		case 0xB0:        // cont. controller (2 more bytes)
		case 0xE0:        // pitch wheel (2 more bytes)
			byte = readByte(input);
			if (!status()) { return m_rwstatus; }
			if (byte > 0x7f) {
				std::cerr << "MIDI data byte too large: " << (int)byte << std::endl;
				m_rwstatus = false; return m_rwstatus;
			}
			array.push_back(byte);
			if (!runningQ) {
				byte = readByte(input);
				if (!status()) { return m_rwstatus; }
				if (byte > 0x7f) {
					std::cerr << "MIDI data byte too large: " << (int)byte << std::endl;
					m_rwstatus = false; return m_rwstatus;
				}
				array.push_back(byte);
			}
			break;
		case 0xC0:        // patch change (1 more byte)
		case 0xD0:        // channel pressure (1 more byte)
			if (!runningQ) {
				byte = readByte(input);
				if (!status()) { return m_rwstatus; }
				if (byte > 0x7f) {
					std::cerr << "MIDI data byte too large: " << (int)byte << std::endl;
					m_rwstatus = false; return m_rwstatus;
				}
				array.push_back(byte);
			}
			break;
		case 0xF0:
			switch (runningCommand) {
				case 0xff:                 // meta event
					{
					if (!runningQ) {
						byte = readByte(input); // meta type
						if (!status()) { return m_rwstatus; }
						array.push_back(byte);
					}
					ulong length = 0;
					uchar byte1 = 0;
					uchar byte2 = 0;
					uchar byte3 = 0;
					uchar byte4 = 0;
					byte1 = readByte(input);
					if (!status()) { return m_rwstatus; }
					array.push_back(byte1);
					if (byte1 >= 0x80) {
						byte2 = readByte(input);
						if (!status()) { return m_rwstatus; }
						array.push_back(byte2);
						if (byte2 > 0x80) {
							byte3 = readByte(input);
							if (!status()) { return m_rwstatus; }
							array.push_back(byte3);
							if (byte3 >= 0x80) {
								byte4 = readByte(input);
								if (!status()) { return m_rwstatus; }
								array.push_back(byte4);
								if (byte4 >= 0x80) {
									std::cerr << "Error: cannot handle large VLVs" << std::endl;
									m_rwstatus = false; return m_rwstatus;
								} else {
									length = unpackVLV(byte1, byte2, byte3, byte4);
									if (!m_rwstatus) { return m_rwstatus; }
								}
							} else {
								length = unpackVLV(byte1, byte2, byte3);
								if (!m_rwstatus) { return m_rwstatus; }
							}
						} else {
							length = unpackVLV(byte1, byte2);
							if (!m_rwstatus) { return m_rwstatus; }
						}
					} else {
						length = byte1;
					}
					for (int j=0; j<(int)length; j++) {
						byte = readByte(input); // meta type
						if (!status()) { return m_rwstatus; }
						array.push_back(byte);
					}
					}
					break;

				// The 0xf0 and 0xf7 meta commands deal with system-exclusive
				// messages. 0xf0 is used to either start a message or to store
				// a complete message.  The 0xf0 is part of the outgoing MIDI
				// bytes.  The 0xf7 message is used to send arbitrary bytes,
				// typically the middle or ends of system exclusive messages.  The
				// 0xf7 byte at the start of the message is not part of the
				// outgoing raw MIDI bytes, but is kept in the MidiFile message
				// to indicate a raw MIDI byte message (typically a partial
				// system exclusive message).
				case 0xf7:   // Raw bytes. 0xf7 is not part of the raw
				             // bytes, but are included to indicate
				             // that this is a raw byte message.
				case 0xf0:   // System Exclusive message
					{         // (complete, or start of message).
					int length = (int)readVLValue(input);
					for (int i=0; i<length; i++) {
						byte = readByte(input);
						if (!status()) { return m_rwstatus; }
						array.push_back(byte);
					}
					}
					break;

				// other "F" MIDI commands are not expected, but can be
				// handled here if they exist.
			}
			break;
		default:
			std::cout << "Error reading midifile" << std::endl;
			std::cout << "Command byte was " << (int)runningCommand << std::endl;
			return 0;
	}
	return 1;
}